

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O2

void __thiscall Test_aialgorithm_fillZero_Test::TestBody(Test_aialgorithm_fillZero_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long lVar1;
  AssertionResult *this_01;
  char *pcVar2;
  AssertionResult local_268;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  
  this_01 = &local_268;
  local_268.message_.ptr_._0_1_ = 0;
  gtest_ar_1.success_ = false;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&gtest_ar,"buf1[0]","\'\\0\'",(char *)&local_268.message_,
             &gtest_ar_1.success_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar_1);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    this_01 = &gtest_ar_1;
LAB_0010ab9d:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_01);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_00);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    memset(&gtest_ar,0,0x210);
    this_00 = &gtest_ar_1.message_;
    for (lVar1 = 0; lVar1 != 0x210; lVar1 = lVar1 + 4) {
      local_268.success_ = false;
      local_268._1_3_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_1,"buf[i]","0",(int *)(&gtest_ar.success_ + lVar1),
                 (int *)&local_268);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_268);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_268.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                   ,0x58,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_268.message_,(Message *)&local_268);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268.message_);
        goto LAB_0010ab9d;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this_00);
    }
  }
  return;
}

Assistant:

TEST_F(Test_aialgorithm, fillZero)
{
    // one
    {
        char buf1[1];
        std::memset(&buf1, 65, sizeof buf1);
        ai::fillZero(buf1);
        ASSERT_EQ(buf1[0], '\0');
    }

    // many
    {
        int        buf[132];
        const auto size2 = ai::countOf(buf);
        std::memset(&buf, 65, size2 * sizeof(int));
        ai::fillZero(buf);
        for (size_t i = 0; i < size2; i++)
        {
            ASSERT_EQ(buf[i], 0);
        }
    }
}